

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

double calculate_sd<dense_parameters>(vw *param_1,dense_parameters *weights)

{
  weight *pwVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  pointer pdVar4;
  long lVar5;
  size_type __n;
  long lVar6;
  double dVar7;
  allocator_type local_39;
  double local_38;
  vector<double,_std::allocator<double>_> diff;
  
  lVar5 = 1L << ((byte)weights->_stride_shift & 0x3f);
  __n = (size_type)calculate_sd<dense_parameters>::my_size;
  for (lVar6 = weights->_weight_mask * 4 + 4; lVar6 != 0; lVar6 = lVar6 + lVar5 * -4) {
    __n = __n + 1;
    calculate_sd<dense_parameters>::my_size = (int)__n;
  }
  local_38 = 0.0;
  for (lVar6 = 0; weights->_weight_mask * 4 + 4 != lVar6; lVar6 = lVar6 + lVar5 * 4) {
    local_38 = local_38 + (double)*(float *)((long)weights->_begin + lVar6);
  }
  local_38 = local_38 / (double)(int)__n;
  std::vector<double,_std::allocator<double>_>::vector(&diff,__n,&local_39);
  pwVar1 = weights->_begin;
  uVar2 = weights->_weight_mask;
  uVar3 = weights->_stride_shift;
  pdVar4 = diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar6 = 0; uVar2 * 4 + 4 != lVar6; lVar6 = lVar6 + (1L << ((byte)uVar3 & 0x3f)) * 4) {
    *pdVar4 = (double)*(float *)((long)pwVar1 + lVar6) - local_38;
    pdVar4 = pdVar4 + 1;
  }
  dVar7 = 0.0;
  for (; diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    dVar7 = dVar7 + *diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start *
                    *diff.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  dVar7 = dVar7 / (double)calculate_sd<dense_parameters>::my_size;
  if (dVar7 < 0.0) {
    local_38 = sqrt(dVar7);
  }
  else {
    local_38 = SQRT(dVar7);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&diff.super__Vector_base<double,_std::allocator<double>_>);
  return local_38;
}

Assistant:

double calculate_sd(vw& /* all */, T& weights)
{
  static int my_size = 0;
  for_each(weights.begin(), weights.end(), [](float /* v */) { my_size += 1; });
  double sum = accumulate(weights.begin(), weights.end(), 0.0);
  double mean = sum / my_size;
  vector<double> diff(my_size);
  transform(weights.begin(), weights.end(), diff.begin(), [mean](double x) { return x - mean; });
  double sq_sum = inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
  return sqrt(sq_sum / my_size);
}